

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O1

wstring * cmsys::Encoding::ToWide(wstring *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  long lVar2;
  char *in_RDX;
  char *extraout_RDX;
  ulong uVar3;
  wstring local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar3 = 0;
  while( true ) {
    if ((uVar3 < str->_M_string_length) && (pcVar1 = (str->_M_dataplus)._M_p, pcVar1[uVar3] != '\0')
       ) {
      ToWide_abi_cxx11_(&local_50,(Encoding *)(pcVar1 + uVar3),in_RDX);
      std::__cxx11::wstring::_M_append
                ((wchar_t *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
      }
    }
    lVar2 = std::__cxx11::string::find((char)str,0);
    if (lVar2 == -1) break;
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    uVar3 = lVar2 + 1;
    in_RDX = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Encoding::ToWide(const std::string& str)
{
  std::wstring wstr;
#  if defined(_WIN32)
  const int wlength = MultiByteToWideChar(
    KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.data(), int(str.size()), NULL, 0);
  if (wlength > 0) {
    wchar_t* wdata = new wchar_t[wlength];
    int r = MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.data(),
                                int(str.size()), wdata, wlength);
    if (r > 0) {
      wstr = std::wstring(wdata, wlength);
    }
    delete[] wdata;
  }
#  else
  size_t pos = 0;
  size_t nullPos = 0;
  do {
    if (pos < str.size() && str.at(pos) != '\0') {
      wstr += ToWide(str.c_str() + pos);
    }
    nullPos = str.find('\0', pos);
    if (nullPos != std::string::npos) {
      pos = nullPos + 1;
      wstr += wchar_t('\0');
    }
  } while (nullPos != std::string::npos);
#  endif
  return wstr;
}